

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialaddress.cpp
# Opt level: O2

void __thiscall
ElementsConfidentialAddress_EmptyAddressTest_Test::ElementsConfidentialAddress_EmptyAddressTest_Test
          (ElementsConfidentialAddress_EmptyAddressTest_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00705c80;
  return;
}

Assistant:

TEST(ElementsConfidentialAddress, EmptyAddressTest) {
  ElementsConfidentialAddress empty_address;
  EXPECT_STREQ("",
               empty_address.GetUnblindedAddress().GetHash().GetHex().c_str());
  EXPECT_STREQ("", empty_address.GetConfidentialKey().GetHex().c_str());

  Address unblind_addr;
  ConfidentialKey key;
  EXPECT_THROW((empty_address = ElementsConfidentialAddress("")), CfdException);
  EXPECT_THROW((empty_address = ElementsConfidentialAddress(unblind_addr, key)),
               CfdException);
}